

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v8::detail::dragonbox::floor_log10_pow2_minus_log10_4_over_3(int e)

{
  if (e + 0x6a4U < 0xd49) {
    return e * 0x134413 + -0x7feff >> 0x16;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
              ,0x39e,"too large exponent");
}

Assistant:

inline int floor_log10_pow2_minus_log10_4_over_3(int e) FMT_NOEXCEPT {
  FMT_ASSERT(e <= 1700 && e >= -1700, "too large exponent");
  const uint64_t log10_4_over_3_fractional_digits = 0x1ffbfc2bbc780375;
  const int shift_amount = 22;
  return (e * static_cast<int>(log10_2_significand >> (64 - shift_amount)) -
          static_cast<int>(log10_4_over_3_fractional_digits >>
                           (64 - shift_amount))) >>
         shift_amount;
}